

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CTypeCheckerVisitor.cpp
# Opt level: O2

void __thiscall CTypeCheckerVisitor::Visit(CTypeCheckerVisitor *this,CMethod *stm)

{
  TypeInfo *left;
  CIdExp *pCVar1;
  CArgumentList *pCVar2;
  CCompoundStm *pCVar3;
  CFieldList *pCVar4;
  IExpression *pIVar5;
  CType *pCVar6;
  bool bVar7;
  __shared_ptr<MethodInfo,_(__gnu_cxx::_Lock_policy)2> *p_Var8;
  TypeInfo *in_RCX;
  string *this_00;
  undefined1 local_a8 [8];
  _Alloc_hider a_Stack_a0 [6];
  string errorMessage;
  TypeInfo expectedType;
  
  this_00 = (string *)local_a8;
  std::operator<<((ostream *)&std::cout,"typechecker: method\n");
  pCVar1 = (stm->name)._M_t.super___uniq_ptr_impl<CIdExp,_std::default_delete<CIdExp>_>._M_t.
           super__Tuple_impl<0UL,_CIdExp_*,_std::default_delete<CIdExp>_>.
           super__Head_base<0UL,_CIdExp_*,_false>._M_head_impl;
  if ((((pCVar1 == (CIdExp *)0x0) ||
       ((stm->arguments)._M_t.
        super___uniq_ptr_impl<CArgumentList,_std::default_delete<CArgumentList>_>._M_t.
        super__Tuple_impl<0UL,_CArgumentList_*,_std::default_delete<CArgumentList>_>.
        super__Head_base<0UL,_CArgumentList_*,_false>._M_head_impl == (CArgumentList *)0x0)) ||
      ((stm->returnExp)._M_t.super___uniq_ptr_impl<IExpression,_std::default_delete<IExpression>_>.
       _M_t.super__Tuple_impl<0UL,_IExpression_*,_std::default_delete<IExpression>_>.
       super__Head_base<0UL,_IExpression_*,_false>._M_head_impl == (IExpression *)0x0)) ||
     ((((stm->returnType)._M_t.super___uniq_ptr_impl<CType,_std::default_delete<CType>_>._M_t.
        super__Tuple_impl<0UL,_CType_*,_std::default_delete<CType>_>.
        super__Head_base<0UL,_CType_*,_false>._M_head_impl == (CType *)0x0 ||
       ((stm->statements)._M_t.
        super___uniq_ptr_impl<CCompoundStm,_std::default_delete<CCompoundStm>_>._M_t.
        super__Tuple_impl<0UL,_CCompoundStm_*,_std::default_delete<CCompoundStm>_>.
        super__Head_base<0UL,_CCompoundStm_*,_false>._M_head_impl == (CCompoundStm *)0x0)) ||
      ((stm->vars)._M_t.super___uniq_ptr_impl<CFieldList,_std::default_delete<CFieldList>_>._M_t.
       super__Tuple_impl<0UL,_CFieldList_*,_std::default_delete<CFieldList>_>.
       super__Head_base<0UL,_CFieldList_*,_false>._M_head_impl == (CFieldList *)0x0)))) {
    CError::CError((CError *)local_a8,&CError::AST_ERROR_abi_cxx11_,
                   &(stm->super_IWrapper).super_PositionedNode.position);
    std::vector<CError,_std::allocator<CError>_>::emplace_back<CError>
              (&this->errors,(CError *)local_a8);
LAB_0011dc3c:
    std::__cxx11::string::~string(this_00);
    local_a8 = (undefined1  [8])0x0;
    a_Stack_a0[0]._M_p = (pointer)0x0;
    std::__shared_ptr<MethodInfo,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->currentMethod).super___shared_ptr<MethodInfo,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<MethodInfo,_(__gnu_cxx::_Lock_policy)2> *)local_a8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)a_Stack_a0);
    return;
  }
  p_Var8 = &std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<MethodInfo>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<MethodInfo>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<MethodInfo>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<MethodInfo>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)&((this->currentClass).
                              super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                             methods,&pCVar1->name)->
            super___shared_ptr<MethodInfo,_(__gnu_cxx::_Lock_policy)2>;
  std::__shared_ptr<MethodInfo,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->currentMethod).super___shared_ptr<MethodInfo,_(__gnu_cxx::_Lock_policy)2>,
             p_Var8);
  std::operator<<((ostream *)&std::cout,"current method was got from symbol table\n");
  pCVar1 = (stm->name)._M_t.super___uniq_ptr_impl<CIdExp,_std::default_delete<CIdExp>_>._M_t.
           super__Tuple_impl<0UL,_CIdExp_*,_std::default_delete<CIdExp>_>.
           super__Head_base<0UL,_CIdExp_*,_false>._M_head_impl;
  (*(code *)**(undefined8 **)&(pCVar1->super_IExpression).super_PositionedNode)(pCVar1,this);
  pCVar2 = (stm->arguments)._M_t.
           super___uniq_ptr_impl<CArgumentList,_std::default_delete<CArgumentList>_>._M_t.
           super__Tuple_impl<0UL,_CArgumentList_*,_std::default_delete<CArgumentList>_>.
           super__Head_base<0UL,_CArgumentList_*,_false>._M_head_impl;
  (*(code *)**(undefined8 **)&(pCVar2->super_IWrapper).super_PositionedNode)(pCVar2,this);
  pCVar3 = (stm->statements)._M_t.
           super___uniq_ptr_impl<CCompoundStm,_std::default_delete<CCompoundStm>_>._M_t.
           super__Tuple_impl<0UL,_CCompoundStm_*,_std::default_delete<CCompoundStm>_>.
           super__Head_base<0UL,_CCompoundStm_*,_false>._M_head_impl;
  (*(code *)**(undefined8 **)&(pCVar3->super_IStatement).super_PositionedNode)(pCVar3,this);
  pCVar4 = (stm->vars)._M_t.super___uniq_ptr_impl<CFieldList,_std::default_delete<CFieldList>_>._M_t
           .super__Tuple_impl<0UL,_CFieldList_*,_std::default_delete<CFieldList>_>.
           super__Head_base<0UL,_CFieldList_*,_false>._M_head_impl;
  (*(code *)**(undefined8 **)&(pCVar4->super_IWrapper).super_PositionedNode)(pCVar4,this);
  pIVar5 = (stm->returnExp)._M_t.
           super___uniq_ptr_impl<IExpression,_std::default_delete<IExpression>_>._M_t.
           super__Tuple_impl<0UL,_IExpression_*,_std::default_delete<IExpression>_>.
           super__Head_base<0UL,_IExpression_*,_false>._M_head_impl;
  (*(code *)*(pIVar5->super_PositionedNode).super_INode._vptr_INode)(pIVar5,this);
  pCVar6 = (stm->returnType)._M_t.super___uniq_ptr_impl<CType,_std::default_delete<CType>_>._M_t.
           super__Tuple_impl<0UL,_CType_*,_std::default_delete<CType>_>.
           super__Head_base<0UL,_CType_*,_false>._M_head_impl;
  if (pCVar6->isPrimitive == true) {
    TypeInfo::TypeInfo(&expectedType,pCVar6->type);
  }
  else {
    TypeInfo::TypeInfo(&expectedType,
                       (string *)
                       ((long)(pCVar6->name)._M_t.
                              super___uniq_ptr_impl<CIdExp,_std::default_delete<CIdExp>_> + 0x18));
  }
  bVar7 = checkTypeExisting(this,(stm->returnType)._M_t.
                                 super___uniq_ptr_impl<CType,_std::default_delete<CType>_>._M_t.
                                 super__Tuple_impl<0UL,_CType_*,_std::default_delete<CType>_>.
                                 super__Head_base<0UL,_CType_*,_false>._M_head_impl);
  if (bVar7) {
    TypeInfo::TypeInfo((TypeInfo *)local_a8,ERROR_TYPE);
    left = &this->lastCalculatedType;
    bVar7 = operator==(left,(TypeInfo *)local_a8);
    std::__cxx11::string::~string((string *)a_Stack_a0);
    if (bVar7) goto LAB_0011dd5a;
    bVar7 = operator!=(left,&expectedType);
    if (!bVar7) {
      TypeInfo::TypeInfo((TypeInfo *)local_a8,VOID);
      TypeInfo::operator=(left,(TypeInfo *)local_a8);
      std::__cxx11::string::~string((string *)a_Stack_a0);
      this_00 = (string *)&expectedType.className;
      goto LAB_0011dc3c;
    }
    CError::GetTypeErrorMessage_abi_cxx11_(&errorMessage,(CError *)&expectedType,left,in_RCX);
    CError::CError((CError *)local_a8,&errorMessage,
                   &(((stm->returnExp)._M_t.
                      super___uniq_ptr_impl<IExpression,_std::default_delete<IExpression>_>._M_t.
                      super__Tuple_impl<0UL,_IExpression_*,_std::default_delete<IExpression>_>.
                      super__Head_base<0UL,_IExpression_*,_false>._M_head_impl)->
                    super_PositionedNode).position);
    std::vector<CError,_std::allocator<CError>_>::emplace_back<CError>
              (&this->errors,(CError *)local_a8);
  }
  else {
    CError::GetUndeclaredErrorMessage
              (&errorMessage,
               (string *)
               ((long)(((stm->returnType)._M_t.
                        super___uniq_ptr_impl<CType,_std::default_delete<CType>_>._M_t.
                        super__Tuple_impl<0UL,_CType_*,_std::default_delete<CType>_>.
                        super__Head_base<0UL,_CType_*,_false>._M_head_impl)->name)._M_t.
                      super___uniq_ptr_impl<CIdExp,_std::default_delete<CIdExp>_> + 0x18));
    CError::CError((CError *)local_a8,&errorMessage,
                   (PositionInfo *)
                   ((long)&(((stm->returnType)._M_t.
                             super___uniq_ptr_impl<CType,_std::default_delete<CType>_>._M_t.
                             super__Tuple_impl<0UL,_CType_*,_std::default_delete<CType>_>.
                             super__Head_base<0UL,_CType_*,_false>._M_head_impl)->super_IWrapper).
                           super_PositionedNode + 8));
    std::vector<CError,_std::allocator<CError>_>::emplace_back<CError>
              (&this->errors,(CError *)local_a8);
  }
  std::__cxx11::string::~string((string *)local_a8);
  std::__cxx11::string::~string((string *)&errorMessage);
LAB_0011dd5a:
  std::__cxx11::string::~string((string *)&expectedType.className);
  return;
}

Assistant:

void CTypeCheckerVisitor::Visit( CMethod &stm ) 
{
	std::cout << "typechecker: method\n";
    if( stm.name && stm.arguments && stm.returnExp && stm.returnType && stm.statements && stm.vars ) {
        currentMethod = currentClass->methods[stm.name->name];
        std::cout << "current method was got from symbol table\n";
        stm.name->Accept( *this );
        stm.arguments->Accept( *this );
        stm.statements->Accept( *this );
        stm.vars->Accept( *this );
        stm.returnExp->Accept( *this );
        TypeInfo expectedType = stm.returnType->isPrimitive ? TypeInfo(stm.returnType->type) : TypeInfo(stm.returnType->name->name);

        bool isVisibleClass = checkTypeExisting(*stm.returnType);
        if( !isVisibleClass ) {
            auto errorMessage = CError::GetUndeclaredErrorMessage( stm.returnType->name->name );
            errors.push_back( CError( errorMessage, stm.returnType->position) );
            return;
        }

        if( lastCalculatedType == enums::TPrimitiveType::ERROR_TYPE ) {
            return;
        }
        if( lastCalculatedType != expectedType ) {
            auto errorMessage = CError::GetTypeErrorMessage( expectedType, lastCalculatedType );
			errors.push_back( CError( errorMessage, stm.returnExp->position ) );
            return;
        }
        lastCalculatedType = enums::TPrimitiveType::VOID;
    } else {
        errors.push_back( CError( CError::AST_ERROR, stm.position ) );
    }
    currentMethod = nullptr;
}